

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

void EvaluateNode(size_t block_start,size_t pos,size_t max_backward_limit,size_t gap,
                 int *starting_dist_cache,ZopfliCostModel *model,StartPosQueue *queue,
                 ZopfliNode *nodes)

{
  size_t *psVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  undefined8 *puVar19;
  int *piVar20;
  uint uVar21;
  size_t sStack_50;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  
  piVar20 = queue->q_[0].distance_cache + pos * 4 + 1;
  fStack_3c = (float)*piVar20;
  if (pos == 0) {
    uVar13 = 0;
  }
  else {
    uVar12 = queue->q_[0].distance_cache[pos * 4 + -1];
    uVar21 = queue->q_[0].distance_cache[pos * 4 + -2] & 0x1ffffff;
    uVar4 = queue->q_[0].distance_cache[pos * 4];
    if ((uVar12 <= max_backward_limit) && ((ulong)uVar12 + (ulong)uVar21 <= block_start + pos)) {
      iVar15 = (uVar4 >> 0x1b) - 1;
      if (uVar4 < 0x8000000) {
        iVar15 = uVar12 + 0xf;
      }
      if (iVar15 != 0) {
        uVar13 = pos & 0xffffffff;
        goto LAB_00114056;
      }
    }
    uVar13 = (ulong)*(uint *)((long)queue + (pos - ((uVar4 & 0x7ffffff) + uVar21)) * 0x10 + 0xc);
  }
LAB_00114056:
  *piVar20 = (int)(float)uVar13;
  fStack_40 = (*(float **)(starting_dist_cache + 0x2c4))[pos] -
              **(float **)(starting_dist_cache + 0x2c4);
  if (fStack_40 < fStack_3c) {
    return;
  }
  fStack_40 = fStack_3c - fStack_40;
  uVar16 = 0;
  if ((float)uVar13 != 0.0) {
    do {
      uVar18 = uVar16;
      uVar12 = queue->q_[0].distance_cache[uVar13 * 4];
      uVar4 = queue->q_[0].distance_cache[uVar13 * 4 + -2];
      uVar16 = uVar18 + 1;
      *(int *)((long)&sStack_50 + uVar18 * 4) = queue->q_[0].distance_cache[uVar13 * 4 + -1];
      if (2 < uVar18) break;
      uVar12 = *(uint *)((long)queue +
                        (uVar13 - ((uVar4 & 0x1ffffff) + (uVar12 & 0x7ffffff))) * 0x10 + 0xc);
      uVar13 = (ulong)uVar12;
    } while (uVar12 != 0);
    if (2 < uVar18) goto LAB_001140f9;
  }
  memcpy((void *)((long)&sStack_50 + uVar16 * 4),(void *)gap,uVar16 * -4 + 0x10);
LAB_001140f9:
  uVar16 = *(long *)(model->cost_cmd_ + 0x40) + 1;
  uVar12 = ~(uint)*(long *)(model->cost_cmd_ + 0x40) & 7;
  uVar13 = 8;
  if (uVar16 < 8) {
    uVar13 = uVar16;
  }
  *(ulong *)(model->cost_cmd_ + 0x40) = uVar16;
  puVar17 = (undefined8 *)((long)model->cost_cmd_ + (ulong)(uVar12 << 5) + 0x10);
  *puVar17 = local_48;
  puVar17[1] = CONCAT44(fStack_3c,fStack_40);
  psVar1 = (size_t *)((long)model->cost_cmd_ + (ulong)(uVar12 << 5));
  *psVar1 = pos;
  psVar1[1] = sStack_50;
  if (1 < uVar16) {
    lVar14 = uVar13 - 1;
    do {
      uVar13 = (ulong)((uVar12 & 7) << 5);
      fVar3 = *(float *)((long)model->cost_cmd_ + uVar13 + 0x18);
      uVar16 = (ulong)((uVar12 + 1 & 7) << 5);
      pfVar2 = (float *)((long)model->cost_cmd_ + uVar16 + 0x18);
      if (*pfVar2 <= fVar3 && fVar3 != *pfVar2) {
        puVar17 = (undefined8 *)((long)model->cost_cmd_ + uVar13);
        puVar19 = (undefined8 *)((long)model->cost_cmd_ + uVar16);
        uVar5 = *puVar17;
        uVar6 = puVar17[1];
        uVar7 = puVar17[2];
        uVar8 = puVar17[3];
        uVar9 = *puVar19;
        uVar10 = puVar19[1];
        uVar11 = puVar19[3];
        puVar17[2] = puVar19[2];
        puVar17[3] = uVar11;
        *puVar17 = uVar9;
        puVar17[1] = uVar10;
        puVar19[2] = uVar7;
        puVar19[3] = uVar8;
        *puVar19 = uVar5;
        puVar19[1] = uVar6;
      }
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  return;
}

Assistant:

static void EvaluateNode(
    const size_t block_start, const size_t pos, const size_t max_backward_limit,
    const size_t gap, const int* starting_dist_cache,
    const ZopfliCostModel* model, StartPosQueue* queue, ZopfliNode* nodes) {
  /* Save cost, because ComputeDistanceCache invalidates it. */
  float node_cost = nodes[pos].u.cost;
  nodes[pos].u.shortcut = ComputeDistanceShortcut(
      block_start, pos, max_backward_limit, gap, nodes);
  if (node_cost <= ZopfliCostModelGetLiteralCosts(model, 0, pos)) {
    PosData posdata;
    posdata.pos = pos;
    posdata.cost = node_cost;
    posdata.costdiff = node_cost -
        ZopfliCostModelGetLiteralCosts(model, 0, pos);
    ComputeDistanceCache(
        pos, starting_dist_cache, nodes, posdata.distance_cache);
    StartPosQueuePush(queue, &posdata);
  }
}